

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  pointer ppvVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeCluster *this_00;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar4;
  pointer ppTVar5;
  ulong uVar6;
  TypeCluster *__tmp;
  ulong uVar7;
  allocator_type local_41;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *local_40;
  value_type local_38;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,pu);
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1720;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1770
  ;
  (this->_m_pBG).px = (element_type *)0x0;
  (this->_m_pBG).pn.pi_ = (sp_counted_base *)0x0;
  this->_m_qJB = (QFunctionJointBeliefInterface *)0x0;
  this->_m_qHybrid = (QHybrid *)0x0;
  (this->_m_pBGJPol).px = (element_type *)0x0;
  (this->_m_pBGJPol).pn.pi_ = (sp_counted_base *)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])(pu);
  local_40 = &this->_m_typeLists;
  local_38 = (value_type)0x0;
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector(local_40,CONCAT44(extraout_var,iVar3),&local_38,&local_41);
  this->_m_thresholdJB = 0.0;
  this->_m_thresholdPjaoh = 0.0;
  iVar3 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])(pu);
  if (CONCAT44(extraout_var_00,iVar3) != 0) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      this_00 = (TypeCluster *)operator_new(0x38);
      TypeCluster::TypeCluster(this_00,0);
      pvVar4 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)operator_new(0x18);
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_start = 0;
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppTVar5 = (pointer)operator_new(8);
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_start = ppTVar5;
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppTVar5;
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppTVar5 + 1;
      *ppTVar5 = this_00;
      (pvVar4->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppTVar5 + 1;
      ppvVar1 = (this->_m_typeLists).
                super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_typeLists).
                        super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3) <= uVar6) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      ppvVar1[uVar6] = pvVar4;
      bVar2 = uVar7 < CONCAT44(extraout_var_00,iVar3);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu
    )
        :
    BayesianGameForDecPOMDPStage(  pu )
    , _m_pBG()
    , _m_qJB(0)
    , _m_qHybrid(0)
    , _m_pBGJPol()
    , _m_typeLists(pu->GetNrAgents(), 0),
    _m_thresholdJB(0),
    _m_thresholdPjaoh(0)

{
    size_t nrAgents = pu->GetNrAgents();
    for(Index agI=0; agI < nrAgents; agI++)
    {
        //remember things are defined as follows:
        //typedef std::vector<TypeCluster* > TypeClusterList
        //std::vector< TypeClusterList* > _m_typeLists;
        Index typeIndex = 0;
        TypeCluster* tc = new TypeCluster( typeIndex );
        TypeClusterList* tcl =  new TypeClusterList(1, tc);
        _m_typeLists.at(agI) = tcl;
    }
}